

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugger.cpp
# Opt level: O2

void __thiscall
breakpoint_recorder::replace_pending(breakpoint_recorder *this,string *name,var *function)

{
  size_t sVar1;
  callable *this_00;
  function *pfVar2;
  anon_union_8_1_a8a14541_for_iterator_1 aVar3;
  iterator iVar4;
  
  sVar1 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,bool>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,bool>>>>
          ::count<std::__cxx11::string>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,bool>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,bool>>>>
                      *)&this->m_pending,name);
  if (sVar1 != 0) {
    this_00 = cs_impl::any::const_val<cs::callable>(function);
    pfVar2 = std::
             function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
             target<cs::function>(&this_00->mFunc);
    pfVar2->mMatch = true;
    iVar4 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,bool>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,bool>>>>
            ::find<std::__cxx11::string>
                      ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,bool>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,bool>>>>
                        *)&this->m_pending,name);
    aVar3 = iVar4.field_1;
    if (*(char *)((long)aVar3.slot_ + 0x28) == '\x01') {
      do {
        this = *(breakpoint_recorder **)&this->m_breakpoints;
        if (this == (breakpoint_recorder *)0x0) {
          return;
        }
      } while (*(long *)&(this->m_pending).
                         super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
               != *(long *)((long)aVar3.slot_ + 0x20));
      variant_impl::variant<unsigned_long,std::__cxx11::string,cs_impl::any>::
      emplace<cs_impl::any,cs_impl::any_const&>
                ((variant<unsigned_long,std::__cxx11::string,cs_impl::any> *)
                 ((long)&this->m_pending + 8),function);
      *(undefined1 *)((long)aVar3.slot_ + 0x28) = 0;
    }
  }
  return;
}

Assistant:

void replace_pending(const std::string &name, const cs::var &function)
	{
		if (m_pending.count(name) > 0) {
			const cs::callable::function_type &target = function.const_val<cs::callable>().get_raw_data();
			target.target<cs::function>()->set_debugger_state(true);
			auto key = m_pending.find(name);
			if (key->second.second) {
				for (auto &it: m_breakpoints) {
					if (it.id == key->second.first) {
						it.data.emplace<cs::var>(function);
						key->second.second = false;
						break;
					}
				}
			}
		}
	}